

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDifference.cpp
# Opt level: O2

void __thiscall OpenMD::CountDifference::doFrame(CountDifference *this,int param_1)

{
  uint uVar1;
  uint uVar2;
  SelectionSet local_38;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_38,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet(&(this->super_SequentialAnalyzer).seleMan1_,&local_38);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_38.bitsets_);
  }
  if ((this->super_SequentialAnalyzer).evaluator2_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_38,&(this->super_SequentialAnalyzer).evaluator2_);
    SelectionManager::setSelectionSet(&(this->super_SequentialAnalyzer).seleMan2_,&local_38);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_38.bitsets_);
  }
  uVar1 = SelectionManager::getSelectionCount(&(this->super_SequentialAnalyzer).seleMan1_);
  uVar2 = SelectionManager::getSelectionCount(&(this->super_SequentialAnalyzer).seleMan2_);
  local_38.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)((double)uVar2 - (double)uVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->values_,(double *)&local_38);
  return;
}

Assistant:

void CountDifference::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    if (evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    unsigned int count1 = seleMan1_.getSelectionCount();
    unsigned int count2 = seleMan2_.getSelectionCount();
        
    RealType c1 = count1;
    RealType c2 = count2;
  
    values_.push_back(c2 - c1);
  }